

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseData<QList<QString>>::resolve<QList<QString>>
          (PromiseData<QList<QString>> *this,QList<QString> *value)

{
  PromiseValue<QList<QString>_> local_28;
  QList<QString> *local_18;
  QList<QString> *value_local;
  PromiseData<QList<QString>_> *this_local;
  
  local_18 = value;
  value_local = (QList<QString> *)this;
  PromiseValue<QList<QString>_>::PromiseValue(&local_28,value);
  PromiseValue<QList<QString>_>::operator=((PromiseValue<QList<QString>_> *)(this + 0x58),&local_28)
  ;
  PromiseValue<QList<QString>_>::~PromiseValue(&local_28);
  PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::setSettled
            ((PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)> *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }